

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O3

void anon_unknown.dwarf_20794a::InitPanning(ALCdevice *device,bool hqdec,bool stablize)

{
  float *pfVar1;
  BFormatDec *__ptr;
  ALCdevice *device_00;
  undefined8 uVar2;
  bool bVar3;
  ALuint o_1;
  uint uVar4;
  undefined1 *puVar5;
  pointer paVar6;
  ulong uVar7;
  array<unsigned_char,_16UL> *paVar8;
  ALuint o;
  long lVar9;
  array<float,_16UL> *paVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  long lVar12;
  char *pcVar13;
  BFormatDec *ptr;
  long lVar14;
  ulong uVar15;
  long lVar16;
  array<float,_16UL> *paVar17;
  size_t main_chans;
  _GLOBAL__N_1 *this;
  BFChannelConfig BVar18;
  undefined *puVar19;
  long lVar20;
  long lVar21;
  pointer main_chans_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffs;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffslf;
  vector<ChannelDec> chancoeffslf;
  vector<ChannelDec> chancoeffs;
  uint local_100;
  char *local_f8;
  undefined1 local_e8 [16];
  pointer local_d8;
  undefined1 local_c8 [16];
  pointer local_b8;
  long local_a8;
  undefined4 local_9c;
  ALCdevice *local_98;
  long local_90;
  value_type local_88;
  ulong local_40;
  long local_38;
  
  local_100 = (uint)device->FmtChans;
  local_9c = (undefined4)CONCAT71(in_register_00000011,stablize);
  local_98 = device;
  switch(device->FmtChans) {
  case DevFmtMono:
    local_f8 = "first";
    lVar14 = 0x1903b8;
    lVar20 = 0x1903a8;
    lVar12 = 0x1903a4;
    lVar21 = 0;
    puVar19 = (undefined *)0x0;
    puVar5 = (undefined *)0x0;
    goto LAB_00159ea5;
  case DevFmtChannelsDefault:
    local_f8 = "first";
    local_100 = 1;
    lVar14 = 0x1903f0;
    lVar20 = 0x1903e0;
    lVar12 = 0x1903d8;
    break;
  case DevFmtQuad:
    local_100 = 2;
    local_f8 = "second";
    puVar5 = (anonymous_namespace)::X51Config;
    puVar19 = (undefined *)0x1904cc;
    lVar21 = 0x1904bc;
    lVar14 = 0x19044c;
    lVar20 = 0x19043c;
    lVar12 = 0x19042c;
    goto LAB_00159ea5;
  case DevFmtX51:
    local_100 = 2;
    local_f8 = "second";
    lVar14 = 0x190560;
    lVar20 = 0x190550;
    lVar12 = 0x190540;
    break;
  case DevFmtX61:
    local_100 = 2;
    local_f8 = "second";
    lVar14 = 0x19068c;
    lVar20 = 0x19067c;
    lVar12 = 0x190668;
    break;
  case DevFmtX71:
    local_100 = 3;
    local_f8 = "third";
    puVar5 = &DAT_001908a4;
    puVar19 = (undefined *)0x1907fc;
    lVar21 = 0x1907ec;
    lVar14 = 0x190744;
    lVar20 = 0x190734;
    lVar12 = 0x19071c;
    goto LAB_00159ea5;
  case DevFmtAmbi3D:
    pcVar13 = (device->DeviceName)._M_dataplus._M_p;
    paVar8 = &AmbiIndex::FromFuMa;
    if (device->mAmbiLayout != FuMa) {
      paVar8 = &AmbiIndex::FromACN;
    }
    paVar17 = &AmbiScale::FromN3D;
    if (device->mAmbiScale == Default) {
      paVar17 = &AmbiScale::FromSN3D;
    }
    paVar10 = &AmbiScale::FromFuMa;
    if (device->mAmbiScale != FuMa) {
      paVar10 = paVar17;
    }
    lVar12 = (ulong)device->mAmbiOrder + 1;
    main_chans = lVar12 * lVar12;
    if (main_chans != 0) {
      lVar12 = 0;
      do {
        BVar18.Index._0_1_ = paVar8->_M_elems[lVar12];
        BVar18.Scale = 1.0 / paVar10->_M_elems[paVar8->_M_elems[lVar12]];
        BVar18.Index._1_3_ = 0;
        (device->Dry).AmbiMap._M_elems[lVar12] = BVar18;
        lVar12 = lVar12 + 1;
      } while (main_chans - lVar12 != 0);
    }
    AllocChannels(device,main_chans,0);
    ConfigValueFloat((char *)&local_88,pcVar13,"decoder");
    if (local_88._M_elems[0]._0_1_ == (default_delete<BFormatDec>)0x0) {
      local_88._M_elems[1] = 0.0;
    }
    else {
    }
    if (local_88._M_elems[1] <= 0.0) {
      return;
    }
    InitNearFieldCtrl(device,local_88._M_elems[1] * 343.3,device->mAmbiOrder,true);
    return;
  case DevFmtX51Rear:
    local_100 = 2;
    local_f8 = "second";
    lVar14 = 0x1905f4;
    lVar20 = 0x1905e4;
    lVar12 = 0x1905d4;
    break;
  default:
    local_100 = 0;
    local_f8 = "first";
    lVar12 = 0;
    lVar20 = 0;
    lVar14 = 0;
  }
  lVar21 = 0;
  puVar19 = (undefined *)0x0;
  puVar5 = (undefined *)0x0;
LAB_00159ea5:
  bVar3 = puVar19 != puVar5 && hqdec;
  local_e8 = ZEXT816(0);
  local_b8 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  local_c8 = local_e8;
  if (lVar20 - lVar12 != 0) {
    local_38 = lVar20 - lVar12 >> 2;
    local_38 = local_38 + (ulong)(local_38 == 0);
    lVar16 = 0;
    local_a8 = lVar12;
    do {
      this = (_GLOBAL__N_1 *)(ulong)*(uint *)(lVar12 + lVar16 * 4);
      uVar7 = (ulong)(local_98->RealOut).ChannelIndex._M_elems[(long)this];
      if (uVar7 == 0xffffffff) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::InitPanning(this);
          lVar12 = local_a8;
        }
      }
      else {
        uVar15 = (long)(local_c8._8_8_ - local_c8._0_8_) >> 6;
        local_40 = uVar7 + 1;
        if (uVar15 <= local_40) {
          uVar15 = local_40;
        }
        local_88._M_elems[0xc] = 0.0;
        local_88._M_elems[0xd] = 0.0;
        local_88._M_elems[0xe] = 0.0;
        local_88._M_elems[0xf] = 0.0;
        local_88._M_elems[8] = 0.0;
        local_88._M_elems[9] = 0.0;
        local_88._M_elems[10] = 0.0;
        local_88._M_elems[0xb] = 0.0;
        local_88._M_elems[4] = 0.0;
        local_88._M_elems[5] = 0.0;
        local_88._M_elems[6] = 0.0;
        local_88._M_elems[7] = 0.0;
        local_88._M_elems._0_8_ = (BFormatDec *)0x0;
        local_88._M_elems[2] = 0.0;
        local_88._M_elems[3] = 0.0;
        local_90 = lVar16;
        std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                  ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
                   local_c8,uVar15,&local_88);
        uVar15 = 0;
        lVar12 = 0;
        do {
          lVar16 = 2 - (ulong)(uVar15 == 0);
          do {
            ((pointer)(local_c8._0_8_ + uVar7 * 0x40))->_M_elems[lVar12] =
                 *(float *)(lVar14 + lVar12 * 4) * *(float *)(lVar20 + uVar15 * 4);
            lVar12 = lVar12 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_100 + 1);
        lVar16 = local_90;
        lVar12 = local_a8;
        if (bVar3) {
          uVar15 = (long)(local_e8._8_8_ - local_e8._0_8_) >> 6;
          if (uVar15 <= local_40) {
            uVar15 = local_40;
          }
          local_88._M_elems[0xc] = 0.0;
          local_88._M_elems[0xd] = 0.0;
          local_88._M_elems[0xe] = 0.0;
          local_88._M_elems[0xf] = 0.0;
          local_88._M_elems[8] = 0.0;
          local_88._M_elems[9] = 0.0;
          local_88._M_elems[10] = 0.0;
          local_88._M_elems[0xb] = 0.0;
          local_88._M_elems[4] = 0.0;
          local_88._M_elems[5] = 0.0;
          local_88._M_elems[6] = 0.0;
          local_88._M_elems[7] = 0.0;
          local_88._M_elems._0_8_ = (BFormatDec *)0x0;
          local_88._M_elems[2] = 0.0;
          local_88._M_elems[3] = 0.0;
          std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                    ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      *)local_e8,uVar15,&local_88);
          uVar15 = 0;
          lVar9 = 0;
          do {
            lVar12 = 2 - (ulong)(uVar15 == 0);
            do {
              ((pointer)(local_e8._0_8_ + uVar7 * 0x40))->_M_elems[lVar9] =
                   *(float *)(puVar19 + lVar9 * 4) * *(float *)(lVar21 + uVar15 * 4);
              lVar9 = lVar9 + 1;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar15 = uVar15 + 1;
            lVar16 = local_90;
            lVar12 = local_a8;
          } while (uVar15 != local_100 + 1);
        }
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x1c;
      puVar19 = puVar19 + 0x1c;
    } while (lVar16 != local_38);
  }
  device_00 = local_98;
  local_98->mAmbiOrder = local_100;
  main_chans_00 = (pointer)(ulong)(local_100 * 2 + 1);
  paVar6 = (pointer)0x0;
  do {
    (local_98->Dry).AmbiMap._M_elems[(long)paVar6] =
         (BFChannelConfig)
         ((ulong)*(byte *)((long)paVar6[0x640d]._M_elems + 0x3f) << 0x20 | 0x3f800000);
    paVar6 = (pointer)((long)paVar6->_M_elems + 1);
  } while (main_chans_00 != paVar6);
  uVar4 = ChannelsFromDevFmt(local_98->FmtChans,local_98->mAmbiOrder);
  AllocChannels(device_00,(size_t)main_chans_00,(ulong)uVar4);
  if ((char)local_9c == '\0') {
LAB_0015a205:
    ptr = (BFormatDec *)0x0;
  }
  else {
    uVar7 = (ulong)(device_00->RealOut).ChannelIndex._M_elems[2];
    if (uVar7 < (ulong)((long)(local_c8._8_8_ - local_c8._0_8_) >> 6)) {
      lVar12 = 0;
      auVar23 = (undefined1  [16])0x0;
      do {
        pfVar1 = ((pointer)(local_c8._0_8_ + uVar7 * 0x40))->_M_elems + lVar12;
        auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
        auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
        auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
        auVar25._12_4_ = -(uint)(pfVar1[3] != 0.0);
        auVar25 = packssdw(auVar25,auVar25);
        auVar25 = packsswb(auVar25,auVar25);
        auVar23 = auVar23 | auVar25 & _DAT_00190170;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      auVar22._0_4_ = auVar23._0_4_ >> 0x10;
      auVar22._4_4_ = 0;
      auVar22._8_4_ = auVar23._8_4_ >> 0x10;
      auVar22._12_4_ = auVar23._12_4_ >> 0x10;
      auVar22 = auVar22 | auVar23;
      auVar23._0_2_ = auVar22._0_2_ >> 8;
      auVar23._2_6_ = 0;
      auVar23._8_2_ = auVar22._8_2_ >> 8;
      auVar23._10_2_ = auVar22._10_2_ >> 8;
      auVar23._12_2_ = auVar22._12_2_ >> 8;
      auVar23._14_2_ = auVar22._14_2_ >> 8;
      uVar11 = SUB164(auVar23 | auVar22,0);
      if (((auVar23 | auVar22) & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0015a18e;
    }
    else {
      uVar11 = 0;
LAB_0015a18e:
      if (uVar7 < (ulong)((long)(local_e8._8_8_ - local_e8._0_8_) >> 6)) {
        auVar23 = ZEXT416(uVar11 & 0xff);
        lVar12 = 0;
        do {
          pfVar1 = ((pointer)(local_e8._0_8_ + uVar7 * 0x40))->_M_elems + lVar12;
          auVar26._4_4_ = -(uint)(pfVar1[1] != 0.0);
          auVar26._0_4_ = -(uint)(*pfVar1 != 0.0);
          auVar26._8_4_ = -(uint)(pfVar1[2] != 0.0);
          auVar26._12_4_ = -(uint)(pfVar1[3] != 0.0);
          auVar25 = packssdw(auVar26,auVar26);
          auVar25 = packsswb(auVar25,auVar25);
          auVar23 = auVar23 | auVar25 & _DAT_00190170;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        auVar24._0_4_ = auVar23._0_4_ >> 0x10;
        auVar24._4_4_ = 0;
        auVar24._8_4_ = auVar23._8_4_ >> 0x10;
        auVar24._12_4_ = auVar23._12_4_ >> 0x10;
        uVar11 = (uint)(ushort)(SUB162(auVar24 | auVar23,0) >> 8) | SUB164(auVar24 | auVar23,0);
      }
    }
    if ((uVar11 & 1) != 0) goto LAB_0015a205;
    uVar4 = ChannelsFromDevFmt(device_00->FmtChans,device_00->mAmbiOrder);
    CreateStablizer((size_t)&local_88,uVar4);
    ptr = (BFormatDec *)local_88._M_elems._0_8_;
    if ((int)gLogLevel < 3) goto LAB_0015a289;
    _GLOBAL__N_1::InitPanning();
  }
  if (2 < (int)gLogLevel) {
    pcVar13 = "single";
    if (bVar3) {
      pcVar13 = "dual";
    }
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Enabling %s-band %s-order%s ambisonic decoder\n",pcVar13
            ,local_f8,0x192663);
  }
LAB_0015a289:
  coeffs.mDataEnd = (pointer)local_c8._0_8_;
  coeffs.mData = main_chans_00;
  coeffslf.mDataEnd = (pointer)local_e8._0_8_;
  coeffslf.mData = (pointer)local_c8._8_8_;
  BFormatDec::Create((size_t)&local_88,coeffs,coeffslf,
                     (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                     local_e8._8_8_);
  uVar2 = local_88._M_elems._0_8_;
  local_88._M_elems._0_8_ = (BFormatDec *)0x0;
  __ptr = (device_00->AmbiDecoder)._M_t.
          super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
          super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
          super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
  (device_00->AmbiDecoder)._M_t.super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>.
  _M_t.super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
  super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl = (BFormatDec *)uVar2;
  if ((__ptr != (BFormatDec *)0x0) &&
     (std::default_delete<BFormatDec>::operator()
                ((default_delete<BFormatDec> *)&device_00->AmbiDecoder,__ptr),
     (BFormatDec *)local_88._M_elems._0_8_ != (BFormatDec *)0x0)) {
    std::default_delete<BFormatDec>::operator()
              ((default_delete<BFormatDec> *)&local_88,(BFormatDec *)local_88._M_elems._0_8_);
  }
  local_88._M_elems[0] = 0.0;
  local_88._M_elems[1] = 0.0;
  if (ptr != (BFormatDec *)0x0) {
    al_free(ptr);
  }
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    al_free((void *)local_e8._0_8_);
  }
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    al_free((void *)local_c8._0_8_);
  }
  return;
}

Assistant:

void InitPanning(ALCdevice *device, const bool hqdec=false, const bool stablize=false)
{
    DecoderView decoder{};
    switch(device->FmtChans)
    {
    case DevFmtMono:
        decoder = MonoConfig;
        break;
    case DevFmtStereo:
        decoder = StereoConfig;
        break;
    case DevFmtQuad:
        decoder = QuadConfig;
        break;
    case DevFmtX51:
        decoder = X51Config;
        break;
    case DevFmtX51Rear:
        decoder = X51RearConfig;
        break;
    case DevFmtX61:
        decoder = X61Config;
        break;
    case DevFmtX71:
        decoder = X71Config;
        break;
    case DevFmtAmbi3D:
        break;
    }

    if(device->FmtChans == DevFmtAmbi3D)
    {
        const char *devname{device->DeviceName.c_str()};
        const std::array<uint8_t,MAX_AMBI_CHANNELS> &acnmap = GetAmbiLayout(device->mAmbiLayout);
        const std::array<float,MAX_AMBI_CHANNELS> &n3dscale = GetAmbiScales(device->mAmbiScale);

        /* For DevFmtAmbi3D, the ambisonic order is already set. */
        const size_t count{AmbiChannelsFromOrder(device->mAmbiOrder)};
        std::transform(acnmap.begin(), acnmap.begin()+count, std::begin(device->Dry.AmbiMap),
            [&n3dscale](const uint8_t &acn) noexcept -> BFChannelConfig
            { return BFChannelConfig{1.0f/n3dscale[acn], acn}; }
        );
        AllocChannels(device, count, 0);

        float nfc_delay{ConfigValueFloat(devname, "decoder", "nfc-ref-delay").value_or(0.0f)};
        if(nfc_delay > 0.0f)
            InitNearFieldCtrl(device, nfc_delay * SpeedOfSoundMetersPerSec, device->mAmbiOrder,
                true);
    }
    else
    {
        const bool dual_band{hqdec && !decoder.mCoeffsLF.empty()};
        al::vector<ChannelDec> chancoeffs, chancoeffslf;
        for(size_t i{0u};i < decoder.mChannels.size();++i)
        {
            const ALuint idx{GetChannelIdxByName(device->RealOut, decoder.mChannels[i])};
            if(idx == INVALID_CHANNEL_INDEX)
            {
                ERR("Failed to find %s channel in device\n",
                    GetLabelFromChannel(decoder.mChannels[i]));
                continue;
            }

            chancoeffs.resize(maxz(chancoeffs.size(), idx+1u), ChannelDec{});
            al::span<float,MAX_AMBI_CHANNELS> coeffs{chancoeffs[idx]};
            size_t start{0};
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffs[i][start] * decoder.mOrderGain[o];
                    ++start;
                } while(--count);
            }
            if(!dual_band)
                continue;

            chancoeffslf.resize(maxz(chancoeffslf.size(), idx+1u), ChannelDec{});
            coeffs = chancoeffslf[idx];
            start = 0;
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffsLF[i][start] * decoder.mOrderGainLF[o];
                    ++start;
                } while(--count);
            }
        }

        /* For non-DevFmtAmbi3D, set the ambisonic order. */
        device->mAmbiOrder = decoder.mOrder;

        /* Built-in speaker decoders are always 2D. */
        const size_t ambicount{Ambi2DChannelsFromOrder(decoder.mOrder)};
        std::transform(AmbiIndex::From2D.begin(), AmbiIndex::From2D.begin()+ambicount,
            std::begin(device->Dry.AmbiMap),
            [](const uint8_t &index) noexcept { return BFChannelConfig{1.0f, index}; }
        );
        AllocChannels(device, ambicount, device->channelsFromFmt());

        std::unique_ptr<FrontStablizer> stablizer;
        if(stablize)
        {
            /* Only enable the stablizer if the decoder does not output to the
             * front-center channel.
             */
            const auto cidx = device->RealOut.ChannelIndex[FrontCenter];
            bool hasfc{false};
            if(cidx < chancoeffs.size())
            {
                for(const auto &coeff : chancoeffs[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc && cidx < chancoeffslf.size())
            {
                for(const auto &coeff : chancoeffslf[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc)
            {
                stablizer = CreateStablizer(device->channelsFromFmt(), device->Frequency);
                TRACE("Front stablizer enabled\n");
            }
        }

        TRACE("Enabling %s-band %s-order%s ambisonic decoder\n",
            !dual_band ? "single" : "dual",
            (decoder.mOrder > 2) ? "third" :
            (decoder.mOrder > 1) ? "second" : "first",
            "");
        device->AmbiDecoder = BFormatDec::Create(ambicount, chancoeffs, chancoeffslf,
            std::move(stablizer));
    }
}